

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

string * __thiscall Json::Value::asString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  char *pcVar1;
  int in_EDX;
  allocator *paVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(this->field_0x8) {
  case 0:
    pcVar1 = "";
    paVar2 = &local_9;
    break;
  case 1:
    beast::lexicalCastThrow<std::__cxx11::string,int>
              (__return_storage_ptr__,(beast *)(ulong)(this->value_).uint_,in_EDX);
    return __return_storage_ptr__;
  case 2:
  case 3:
  case 6:
  case 7:
    jbcoin::Throw<std::runtime_error,char_const(&)[34]>
              ((char (*) [34])"Type is not convertible to string");
  case 4:
    pcVar1 = "";
    if ((this->value_).string_ != (char *)0x0) {
      pcVar1 = (this->value_).string_;
    }
    paVar2 = &local_a;
    break;
  case 5:
    pcVar1 = "false";
    if ((this->value_).bool_ != false) {
      pcVar1 = "true";
    }
    paVar2 = &local_b;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/json/impl/json_value.cpp"
                  ,0x217,"std::string Json::Value::asString() const");
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string
Value::asString () const
{
    switch ( type_ )
    {
    case nullValue:
        return "";

    case stringValue:
        return value_.string_ ? value_.string_ : "";

    case booleanValue:
        return value_.bool_ ? "true" : "false";

    case intValue:
        return beast::lexicalCastThrow <std::string> (value_.int_);

    case uintValue:
    case realValue:
    case arrayValue:
    case objectValue:
        JSON_ASSERT_MESSAGE ( false, "Type is not convertible to string" );

    default:
        JSON_ASSERT_UNREACHABLE;
    }

    return ""; // unreachable
}